

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O0

ostream * operator<<(ostream *out,FlatMap<Point,_double,_PointCmp> *map)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  undefined8 in_RSI;
  char *pcVar4;
  ostream *in_RDI;
  pair<Point,_double> *v;
  const_iterator __end0;
  const_iterator __begin0;
  FlatMap<Point,_double,_PointCmp> *__range1;
  size_t i;
  FlatMap<Point,_double,_PointCmp> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  local_28;
  undefined8 local_20;
  long local_18;
  undefined8 local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"{ ");
  local_18 = 0;
  local_20 = local_10;
  local_28._M_current =
       (pair<Point,_double> *)FlatMap<Point,_double,_PointCmp>::begin(in_stack_ffffffffffffffb8);
  FlatMap<Point,_double,_PointCmp>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
             ::operator*(&local_28);
    pcVar4 = ", ";
    if (local_18 == 0) {
      pcVar4 = "";
    }
    local_18 = local_18 + 1;
    poVar3 = std::operator<<(local_8,pcVar4);
    std::operator<<(poVar3,"[");
    in_stack_ffffffffffffffb8 = (FlatMap<Point,_double,_PointCmp> *)(ppVar2->first).x;
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
          *)(ppVar2->first).y;
    poVar3 = operator<<((ostream *)0x1fe44f,ppVar2->first);
    poVar3 = std::operator<<(poVar3,"] -> ");
    std::ostream::operator<<(poVar3,ppVar2->second);
    __gnu_cxx::
    __normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
    ::operator++(&local_28);
  }
  poVar3 = std::operator<<(local_8," }");
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}